

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitSuspend(InternalAnalyzer *this,Suspend *curr)

{
  bool bVar1;
  Suspend *curr_local;
  InternalAnalyzer *this_local;
  
  this->parent->calls = true;
  bVar1 = FeatureSet::hasExceptionHandling(&this->parent->features);
  if ((bVar1) && (this->parent->tryDepth == 0)) {
    this->parent->throws_ = true;
  }
  this->parent->implicitTrap = true;
  return;
}

Assistant:

void visitSuspend(Suspend* curr) {
      // Similar to resume/call: Suspending means that we execute arbitrary
      // other code before we may resume here.
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }

      // A suspend may go unhandled and therefore trap.
      parent.implicitTrap = true;
    }